

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O3

void ncnn::gridsample_2d_bicubic_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 (*pauVar7) [64];
  uint *puVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar32 [64];
  undefined1 in_ZMM20 [64];
  __m512 value_f [4];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  iVar1 = dst->c;
  if (0 < (long)iVar1) {
    iVar3 = dst->h * dst->w;
    lVar5 = 0;
    auVar12 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar13 = vbroadcastss_avx512f(ZEXT416(0x3f400000));
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x40700000));
    auVar15 = vbroadcastss_avx512f(ZEXT416(0xc0c00000));
    auVar16 = vbroadcastss_avx512f(ZEXT416(0x40400000));
    auVar17 = vbroadcastss_avx512f(ZEXT416(0x3fa00000));
    auVar18 = vbroadcastss_avx512f(ZEXT416(0xc0100000));
    auVar19 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    do {
      if (0 < iVar3) {
        lVar6 = src->cstep * lVar5 * src->elemsize;
        pvVar2 = src->data;
        puVar8 = (uint *)offset_value->data;
        pauVar7 = (undefined1 (*) [64])(dst->cstep * lVar5 * dst->elemsize + (long)dst->data);
        iVar4 = 0;
        do {
          auVar20 = vbroadcastss_avx512f(ZEXT416(*puVar8));
          fVar29 = auVar20._0_4_;
          auVar21 = vbroadcastss_avx512f(ZEXT416((uint)(fVar29 + 1.0)));
          fVar30 = 1.0 - fVar29;
          auVar22 = vbroadcastss_avx512f(ZEXT416((uint)fVar30));
          auVar23 = vfmsub213ps_avx512f(auVar13,auVar21,auVar14);
          auVar23 = vfnmadd213ps_avx512f(auVar23,auVar21,auVar15);
          auVar21 = vfmadd213ps_avx512f(auVar23,auVar21,auVar16);
          auVar20 = vfmadd213ps_avx512f(auVar20,auVar17,auVar18);
          auVar23 = vbroadcastss_avx512f(ZEXT416((uint)(fVar29 * fVar29)));
          auVar20 = vmulps_avx512f(auVar20,auVar23);
          auVar23 = vaddps_avx512f(auVar20,auVar12);
          auVar22 = vfmadd213ps_avx512f(auVar22,auVar17,auVar18);
          auVar24 = vbroadcastss_avx512f(ZEXT416((uint)(fVar30 * fVar30)));
          auVar22 = vfmadd213ps_avx512f(auVar24,auVar22,auVar12);
          auVar20 = vaddps_avx512f(auVar22,auVar20);
          auVar20 = vaddps_avx512f(auVar21,auVar20);
          auVar20 = vxorps_avx512dq(auVar20,auVar19);
          auVar24 = vbroadcastss_avx512f(ZEXT416(puVar8[1]));
          fVar30 = auVar24._0_4_;
          auVar25 = vbroadcastss_avx512f(ZEXT416((uint)(fVar30 + 1.0)));
          auVar11 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar24._0_16_);
          auVar26 = vbroadcastss_avx512f(auVar11);
          auVar27 = vfmsub213ps_avx512f(auVar13,auVar25,auVar14);
          auVar27 = vfnmadd213ps_avx512f(auVar27,auVar25,auVar15);
          auVar25 = vfmadd213ps_avx512f(auVar27,auVar25,auVar16);
          auVar24 = vfmadd213ps_avx512f(auVar24,auVar17,auVar18);
          auVar27 = vbroadcastss_avx512f(ZEXT416((uint)(fVar30 * fVar30)));
          auVar24 = vmulps_avx512f(auVar24,auVar27);
          auVar26 = vfmadd213ps_avx512f(auVar26,auVar17,auVar18);
          auVar11 = vmulss_avx512f(auVar11,auVar11);
          auVar27 = vbroadcastss_avx512f(auVar11);
          auVar27 = vfmadd213ps_avx512f(auVar27,auVar26,auVar12);
          auVar28 = vaddps_avx512f(auVar27,auVar24);
          auVar28 = vaddps_avx512f(auVar25,auVar28);
          lVar9 = 0;
          do {
            lVar10 = (long)*(int *)((long)puVar8 + lVar9 + 8);
            auVar11 = vxorps_avx512vl(auVar26._0_16_,auVar26._0_16_);
            auVar31 = ZEXT1664(auVar11);
            auVar11 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
            auVar26 = ZEXT1664(auVar11);
            if (-1 < lVar10) {
              auVar26 = *(undefined1 (*) [64])((long)pvVar2 + lVar10 * 4 + lVar6);
            }
            lVar10 = (long)*(int *)((long)puVar8 + lVar9 + 0xc);
            if (-1 < lVar10) {
              auVar31 = *(undefined1 (*) [64])((long)pvVar2 + lVar10 * 4 + lVar6);
            }
            lVar10 = (long)*(int *)((long)puVar8 + lVar9 + 0x10);
            auVar11 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
            in_ZMM20 = ZEXT1664(auVar11);
            auVar11 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
            auVar32 = ZEXT1664(auVar11);
            if (-1 < lVar10) {
              auVar32 = *(undefined1 (*) [64])((long)pvVar2 + lVar10 * 4 + lVar6);
            }
            lVar10 = (long)*(int *)((long)puVar8 + lVar9 + 0x14);
            if (-1 < lVar10) {
              in_ZMM20 = *(undefined1 (*) [64])((long)pvVar2 + lVar10 * 4 + lVar6);
            }
            in_ZMM18 = vmulps_avx512f(auVar26,auVar21);
            auVar26 = vfmadd213ps_avx512f(auVar31,auVar23,in_ZMM18);
            auVar31 = vfmadd213ps_avx512f(auVar32,auVar22,auVar26);
            in_ZMM19 = vfmadd231ps_avx512f(auVar31,auVar20,in_ZMM20);
            *(undefined1 (*) [64])(local_180 + lVar9 * 4) = in_ZMM19;
            lVar9 = lVar9 + 0x10;
          } while (lVar9 != 0x40);
          auVar20 = vaddps_avx512f(auVar24,auVar12);
          auVar21 = vmulps_avx512f(auVar25,local_180);
          auVar20 = vfmadd231ps_avx512f(auVar21,auVar20,local_140);
          auVar20 = vfmadd231ps_avx512f(auVar20,auVar27,local_100);
          auVar20 = vfnmadd231ps_avx512f(auVar20,auVar28,local_c0);
          *pauVar7 = auVar20;
          pauVar7 = pauVar7 + 1;
          puVar8 = puVar8 + 0x12;
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p16(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m512 x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
            __m512 y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
            __m512 value_f[4];
            cubic_interp1d_p16(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, _mm512_set1_ps(offset_value_ptr[0]));
            cubic_interp1d_p16(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, _mm512_set1_ps(offset_value_ptr[1]));

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                __m512 x0_val = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
                __m512 x1_val = offset_ptr[1] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[1]) : _mm512_set1_ps(0);
                __m512 x2_val = offset_ptr[2] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[2]) : _mm512_set1_ps(0);
                __m512 x3_val = offset_ptr[3] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[3]) : _mm512_set1_ps(0);

                value_f[ii] = _mm512_mul_ps(x_coeffs0, x0_val);
                value_f[ii] = _mm512_fmadd_ps(x_coeffs1, x1_val, value_f[ii]);
                value_f[ii] = _mm512_fmadd_ps(x_coeffs2, x2_val, value_f[ii]);
                value_f[ii] = _mm512_fmadd_ps(x_coeffs3, x3_val, value_f[ii]);

                offset_ptr += 4;
            }

            __m512 _v = _mm512_mul_ps(y_coeffs0, value_f[0]);
            _v = _mm512_fmadd_ps(y_coeffs1, value_f[1], _v);
            _v = _mm512_fmadd_ps(y_coeffs2, value_f[2], _v);
            _v = _mm512_fmadd_ps(y_coeffs3, value_f[3], _v);
            _mm512_storeu_ps(dstptr, _v);

            dstptr += 16;
            offset_value_ptr += 18;
        }
    }
}